

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O0

void RentalThreadContextManager::DestroyThreadContext(ThreadContext *threadContext)

{
  bool deleteThreadContext;
  ThreadContext *threadContext_local;
  
  ThreadContextManagerBase::ShutdownThreadContext(threadContext,true);
  return;
}

Assistant:

void RentalThreadContextManager::DestroyThreadContext(ThreadContext* threadContext)
{
    bool deleteThreadContext = true;

#ifdef CHAKRA_STATIC_LIBRARY
    // xplat-todo: Cleanup staticlib shutdown. Deleting contexts / finalizers having
    // trouble with current runtime/context.
    deleteThreadContext = false;
#endif

    ShutdownThreadContext(threadContext, deleteThreadContext);
}